

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int i;
  int iVar6;
  undefined8 local_38;
  int n;
  int v;
  
  local_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
  std::istream::ignore();
  poVar2 = std::operator<<((ostream *)&std::cerr,"n == ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar5 = 0x18894;
  iVar4 = -1;
  for (iVar6 = 1; iVar6 <= (int)local_38; iVar6 = iVar6 + 1) {
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_38 + 4));
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38._4_4_);
    poVar2 = std::operator<<(poVar2," ");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = -local_38._4_4_;
    if (0 < (int)local_38._4_4_) {
      uVar1 = local_38._4_4_;
    }
    uVar3 = -uVar5;
    if (0 < (int)uVar5) {
      uVar3 = uVar5;
    }
    if ((uVar1 < uVar3) || (((0 < (int)local_38._4_4_ && ((int)uVar5 < 0)) && (uVar3 == uVar1)))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"yes");
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar5 = local_38._4_4_;
      iVar4 = iVar6;
    }
  }
  if (iVar4 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"0");
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main()
{
	int n;
    std::cin >> n;
    std::cin.ignore();
	std::cerr << "n == " << n << std::endl;
	
	int v;
	int min = -1;
	int mvalue = 100500;
	for (int i = 1; i <= n; i++)
	{
        std::cin >> v;
		std::cerr << i << ": " << v << " " << std::endl;
		if (abs(v) < abs(mvalue)
		    || (abs(mvalue) == abs(v) && mvalue < 0 && v > 0))
	    {
	        std::cerr << "yes" << std::endl;
	        min = i;
	        mvalue = v;
	    }
	}
	
	if (-1 == min)
	{
	    std::cout << "0" << std::endl;
	} else
	{
	    std::cout << mvalue << std::endl;
	}

	return 0;
}